

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.cpp
# Opt level: O0

void __thiscall liblogger::Trace::Log(Trace *this,char *fmt,...)

{
  allocator<char> *in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  TraceLock lock;
  string str;
  int res;
  va_list ap;
  char *tmp;
  Trace *in_stack_fffffffffffffea8;
  TraceLock *this_00;
  value_type *__x;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined1 local_61 [37];
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  TraceLock *local_18;
  char *local_10;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8;
  
  local_18 = (TraceLock *)0x0;
  local_28 = local_138;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_128 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_3c = vasprintf((char **)&local_18,in_RSI,&local_38);
  if (local_3c < 0) {
    abort();
  }
  __x = (value_type *)local_61;
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_R9,in_R8,in_RCX);
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  TraceLock::TraceLock(this_00,in_stack_fffffffffffffea8);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_RDI,__x);
  TraceLock::Unlock(this_00);
  free(local_18);
  TraceLock::~TraceLock(this_00);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  return;
}

Assistant:

void Trace::Log(const char *fmt, ...) {
	char *tmp = 0;
	
	va_list ap;
	va_start(ap, fmt);
	int res = vasprintf(&tmp, fmt, ap);
	if (res < 0)
		abort();
    
	std::string str = tmp;
    TraceLock lock(this);
	m_lst.push_back(str);
    lock.Unlock();
	free(tmp);
	va_end(ap);
}